

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O2

void __thiscall camp::ForbiddenCall::ForbiddenCall(ForbiddenCall *this,string *functionName)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,"the function ",functionName);
  std::operator+(&local_50,&local_30," is not callable");
  Error::Error(&this->super_Error,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  *(undefined ***)&this->super_Error = &PTR__Error_00141588;
  return;
}

Assistant:

ForbiddenCall::ForbiddenCall(const std::string& functionName)
    : Error("the function " + functionName + " is not callable")
{
}